

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void i4_factor(int n,int maxfactor,int *nfactor,int *factor,int *power,int *nleft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int p;
  int maxprime;
  int i;
  int *nleft_local;
  int *power_local;
  int *factor_local;
  int *nfactor_local;
  int maxfactor_local;
  int n_local;
  
  *nfactor = 0;
  for (p = 0; p < maxfactor; p = p + 1) {
    factor[p] = 0;
  }
  for (p = 0; p < maxfactor; p = p + 1) {
    power[p] = 0;
  }
  *nleft = n;
  if (n != 0) {
    if (n < 1) {
      n = -n;
    }
    if (n == 1) {
      *nfactor = 1;
      *factor = 1;
      *power = 1;
    }
    else {
      iVar1 = prime(-1);
      for (p = 1; p <= iVar1; p = p + 1) {
        iVar2 = prime(p);
        iVar3 = *nleft;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if ((iVar3 % iVar2 == 0) && (*nfactor < maxfactor)) {
          *nfactor = *nfactor + 1;
          factor[*nfactor + -1] = iVar2;
          do {
            power[*nfactor + -1] = power[*nfactor + -1] + 1;
            *nleft = *nleft / iVar2;
            iVar3 = *nleft;
            if (iVar3 < 1) {
              iVar3 = -iVar3;
            }
          } while (iVar3 % iVar2 == 0);
          iVar3 = *nleft;
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 == 1) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void i4_factor ( int n, int maxfactor, int &nfactor, int factor[], 
  int power[], int &nleft )

//****************************************************************************80
//
//  Purpose:
//
//    I4_FACTOR factors an integer into prime factors.
//
//  Discussion:
//
//    N = NLEFT * Product ( 1 <= I <= NFACTOR ) FACTOR(I)^POWER(I).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 February 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be factored.  N may be positive,
//    negative, or 0.
//
//    Input, int MAXFACTOR, the maximum number of prime factors for
//    which storage has been allocated.
//
//    Output, int &NFACTOR, the number of prime factors of N discovered
//    by the routine.
//
//    Output, int FACTOR[MAXFACTOR], the prime factors of N.
//
//    Output, int POWER[MAXFACTOR].  POWER(I) is the power of
//    the FACTOR(I) in the representation of N.
//
//    Output, int &NLEFT, the factor of N that the routine could not
//    divide out.  If NLEFT is 1, then N has been completely factored.
//    Otherwise, NLEFT represents factors of N involving large primes.
//
{
  int i;
  int maxprime;
  int p;

  nfactor = 0;

  for ( i = 0; i < maxfactor; i++ )
  {
    factor[i] = 0;
  }

  for ( i = 0; i < maxfactor; i++ )
  {
    power[i] = 0;
  }

  nleft = n;

  if ( n == 0 )
  {
    return;
  }

  if ( abs ( n ) == 1 )
  {
    nfactor = 1;
    factor[0] = 1;
    power[0] = 1;
    return;
  }
//
//  Find out how many primes we stored.
//
  maxprime = prime ( -1 );
//
//  Try dividing the remainder by each prime.
//
  for ( i = 1; i <= maxprime; i++ )
  {
    p = prime ( i );

    if ( abs ( nleft ) % p == 0 )
    {
      if ( nfactor < maxfactor )
      {
        nfactor = nfactor + 1;
        factor[nfactor-1] = p;

        for ( ; ; )
        {
          power[nfactor-1] = power[nfactor-1] + 1;
          nleft = nleft / p;

          if ( abs ( nleft ) % p != 0 )
          {
            break;
          }

        }

        if ( abs ( nleft ) == 1 )
        {
          break;
        }
      }
    }
  }

  return;
}